

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cast.h
# Opt level: O2

bool __thiscall
pybind11::detail::type_caster_generic::load_impl<pybind11::detail::type_caster_generic>
          (type_caster_generic *this,handle src,bool convert)

{
  byte bVar1;
  PyTypeObject *type;
  pointer pptVar2;
  pointer pp_Var3;
  bool bVar4;
  int iVar5;
  uint uVar6;
  vector<pybind11::detail::type_info_*,_std::allocator<pybind11::detail::type_info_*>_> *pvVar7;
  ulong uVar8;
  type_info *ptVar9;
  pointer pptVar10;
  pointer pp_Var11;
  object temp;
  
  if (src.m_ptr == (PyObject *)0x0) {
LAB_00117970:
    bVar4 = false;
  }
  else {
    if (this->typeinfo == (type_info *)0x0) {
      bVar4 = try_load_foreign_module_local(this,src);
      return bVar4;
    }
    if (src.m_ptr == (PyObject *)&_Py_NoneStruct) {
      if (!convert) goto LAB_00117970;
      this->value = (void *)0x0;
    }
    else {
      type = (src.m_ptr)->ob_type;
      if (type != this->typeinfo->type) {
        iVar5 = PyType_IsSubtype(type);
        if (iVar5 == 0) goto LAB_001179e8;
        pvVar7 = all_type_info(type);
        bVar1 = this->typeinfo->field_0x90;
        pptVar10 = (pvVar7->
                   super__Vector_base<pybind11::detail::type_info_*,_std::allocator<pybind11::detail::type_info_*>_>
                   )._M_impl.super__Vector_impl_data._M_start;
        pptVar2 = (pvVar7->
                  super__Vector_base<pybind11::detail::type_info_*,_std::allocator<pybind11::detail::type_info_*>_>
                  )._M_impl.super__Vector_impl_data._M_finish;
        uVar8 = (long)pptVar2 - (long)pptVar10;
        if (uVar8 == 8) {
          if (((bVar1 & 1) != 0) || ((*pptVar10)->type == this->typeinfo->type)) goto LAB_00117923;
        }
        else if (8 < uVar8) {
          do {
            if (pptVar10 == pptVar2) goto LAB_001179c9;
            ptVar9 = *pptVar10;
            if ((bVar1 & 1) == 0) {
              uVar6 = (uint)(ptVar9->type == this->typeinfo->type);
            }
            else {
              uVar6 = PyType_IsSubtype();
            }
            pptVar10 = pptVar10 + 1;
          } while (uVar6 == 0);
          instance::get_value_and_holder
                    ((value_and_holder *)&temp,(instance *)src.m_ptr,ptVar9,true);
          goto LAB_0011793e;
        }
LAB_001179c9:
        bVar4 = try_implicit_casts(this,src,convert);
        if (bVar4) {
          return true;
        }
LAB_001179e8:
        if (convert) {
          pp_Var3 = (this->typeinfo->implicit_conversions).
                    super__Vector_base<_object_*(*)(_object_*,__typeobject_*),_std::allocator<_object_*(*)(_object_*,__typeobject_*)>_>
                    ._M_impl.super__Vector_impl_data._M_finish;
          for (pp_Var11 = (this->typeinfo->implicit_conversions).
                          super__Vector_base<_object_*(*)(_object_*,__typeobject_*),_std::allocator<_object_*(*)(_object_*,__typeobject_*)>_>
                          ._M_impl.super__Vector_impl_data._M_start; pp_Var11 != pp_Var3;
              pp_Var11 = pp_Var11 + 1) {
            temp.super_handle.m_ptr = (handle)(**pp_Var11)(src.m_ptr,this->typeinfo->type);
            bVar4 = load_impl<pybind11::detail::type_caster_generic>(this,temp.super_handle,false);
            if (bVar4) {
              loader_life_support::add_patient(temp.super_handle.m_ptr);
              object::~object(&temp);
              goto LAB_00117a9b;
            }
            object::~object(&temp);
          }
          bVar4 = try_direct_conversions(this,src);
          if (bVar4) {
            return true;
          }
        }
        if ((this->typeinfo->field_0x90 & 8) != 0) {
          temp.super_handle.m_ptr = (handle)this->typeinfo->cpptype;
          ptVar9 = get_global_type_info((type_index *)&temp);
          if (ptVar9 != (type_info *)0x0) {
            this->typeinfo = ptVar9;
            bVar4 = load_impl<pybind11::detail::type_caster_generic>(this,src,false);
            return bVar4;
          }
        }
        bVar4 = try_load_foreign_module_local(this,src);
        return bVar4;
      }
LAB_00117923:
      instance::get_value_and_holder
                ((value_and_holder *)&temp,(instance *)src.m_ptr,(type_info *)0x0,true);
LAB_0011793e:
      load_value(this,(value_and_holder *)&temp);
    }
LAB_00117a9b:
    bVar4 = true;
  }
  return bVar4;
}

Assistant:

PYBIND11_NOINLINE inline handle get_type_handle(const std::type_info &tp, bool throw_if_missing) {
    detail::type_info *type_info = get_type_info(tp, throw_if_missing);
    return handle(type_info ? ((PyObject *) type_info->type) : nullptr);
}